

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O0

void __thiscall
Deque<int,_std::allocator<int>_>::Deque
          (Deque<int,_std::allocator<int>_> *this,Deque<int,_std::allocator<int>_> *other)

{
  Deque<int,_std::allocator<int>_> *other_00;
  size_t sVar1;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RSI;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RDI;
  Deque<int,_std::allocator<int>_> *this_00;
  undefined1 local_26;
  undefined1 local_25 [20];
  undefined1 local_11 [17];
  
  local_11._1_8_ = in_RSI;
  other_00 = (Deque<int,_std::allocator<int>_> *)
             RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
             ::max_size(in_RSI);
  this_00 = (Deque<int,_std::allocator<int>_> *)local_11;
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x16ee04);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(in_RDI,other_00,this_00);
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::~allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x16ee24);
  sVar1 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
          ::max_size((RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
                      *)(local_11._1_8_ + 0x30));
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x16ee54);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(in_RDI + 1,sVar1,local_25);
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::~allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x16ee74);
  sVar1 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
          ::max_size((RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
                      *)(local_11._1_8_ + 0x60));
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x16eea4);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(in_RDI + 2,sVar1,&local_26);
  std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::~allocator
            ((allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)0x16eec4);
  std::allocator<int>::allocator((allocator<int> *)0x16eeda);
  Deque<int,std::allocator<int>>::copy<std::allocator<int>>(this_00,other_00);
  return;
}

Assistant:

Deque(const Deque &other) :
            small_(other.small_.max_size()),
            current_(other.current_.max_size()),
            big_(other.big_.max_size()),
            allocator_() {
        copy(other);
    }